

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

int32_t __thiscall icu_63::RegexCompile::blockTopLoc(RegexCompile *this,UBool reserveLoc)

{
  int iVar1;
  UVector64 *this_00;
  uint index;
  int64_t elem;
  bool bVar2;
  
  fixLiterals(this,'\x01');
  this_00 = this->fRXPat->fCompiledPat;
  iVar1 = this_00->count;
  if (iVar1 == this->fMatchCloseParen) {
    index = this->fMatchOpenParen;
  }
  else {
    if (iVar1 < 1) {
      bVar2 = false;
    }
    else {
      bVar2 = *(char *)((long)this_00->elements + (ulong)(iVar1 - 1U) * 8 + 3) == '\x05';
    }
    index = iVar1 - 1U;
    if (bVar2) {
      index = iVar1 - 2;
    }
    if (reserveLoc != '\0') {
      elem = 0x7000000;
      if (U_ZERO_ERROR < *this->fStatus) {
        elem = 0;
      }
      UVector64::insertElementAt(this_00,elem,index,this->fStatus);
    }
  }
  return index;
}

Assistant:

int32_t   RegexCompile::blockTopLoc(UBool reserveLoc) {
    int32_t   theLoc;
    fixLiterals(TRUE);  // Emit code for any pending literals.
                        //   If last item was a string, emit separate op for the its last char.
    if (fRXPat->fCompiledPat->size() == fMatchCloseParen)
    {
        // The item just processed is a parenthesized block.
        theLoc = fMatchOpenParen;   // A slot is already reserved for us.
        U_ASSERT(theLoc > 0);
        U_ASSERT(URX_TYPE(((uint32_t)fRXPat->fCompiledPat->elementAti(theLoc))) == URX_NOP);
    }
    else {
        // Item just compiled is a single thing, a ".", or a single char, a string or a set reference.
        // No slot for STATE_SAVE was pre-reserved in the compiled code.
        // We need to make space now.
        theLoc = fRXPat->fCompiledPat->size()-1;
        int32_t opAtTheLoc = (int32_t)fRXPat->fCompiledPat->elementAti(theLoc);
        if (URX_TYPE(opAtTheLoc) == URX_STRING_LEN) {
            // Strings take two opcode, we want the position of the first one.
            // We can have a string at this point if a single character case-folded to two.
            theLoc--;
        }
        if (reserveLoc) {
            int32_t  nop = buildOp(URX_NOP, 0);
            fRXPat->fCompiledPat->insertElementAt(nop, theLoc, *fStatus);
        }
    }
    return theLoc;
}